

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuMatrix.hpp
# Opt level: O2

void __thiscall tcu::Matrix<float,_3,_2>::Matrix(Matrix<float,_3,_2> *this,float *src)

{
  int row;
  long lVar1;
  
  Vector<tcu::Vector<float,_3>,_2>::Vector(&this->m_data);
  for (lVar1 = 0; lVar1 != 3; lVar1 = lVar1 + 1) {
    (this->m_data).m_data[0].m_data[lVar1] = src[lVar1 * 2];
    (this->m_data).m_data[1].m_data[lVar1] = src[lVar1 * 2 + 1];
  }
  return;
}

Assistant:

Matrix<T, Rows, Cols>::Matrix (const T src[Rows*Cols])
{
	for (int row = 0; row < Rows; row++)
		for (int col = 0; col < Cols; col++)
			(*this)(row, col) = src[row*Cols + col];
}